

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

leb_NodeAndNeighbors *
leb_DecodeNodeAndNeighbors
          (leb_NodeAndNeighbors *__return_storage_ptr__,leb_Heap *leb,uint32_t threadID)

{
  undefined1 auVar1 [12];
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  leb_Node node;
  leb_Node node_00;
  leb_Node node_01;
  leb_Node node_02;
  leb_Node node_03;
  leb_Node lVar5;
  leb_SameDepthNeighborIDs nodeIDs;
  
  lVar5.depth = 0;
  lVar5.id = leb->maxDepth;
  uVar2 = leb__HeapRead((leb_Heap *)leb->buffer,lVar5);
  if (uVar2 < 2) {
    uVar2 = 1;
    iVar4 = 0;
    auVar1 = SUB1612(ZEXT816(0),0);
  }
  else {
    iVar4 = 0;
    nodeIDs = (leb_SameDepthNeighborIDs)(ZEXT816(0x100000000) << 0x40);
    do {
      node.depth = 0;
      node.id = leb->maxDepth;
      uVar3 = leb__HeapRead((leb_Heap *)leb->buffer,node);
      uVar2 = uVar3;
      if (uVar3 > threadID) {
        uVar2 = 0;
      }
      nodeIDs = leb__SplitNodeIDs(nodeIDs,(uint)(uVar3 <= threadID));
      auVar1 = nodeIDs._0_12_;
      threadID = threadID - uVar2;
      uVar2 = nodeIDs._reserved;
      node_00.depth = 0;
      node_00.id = leb->maxDepth;
      uVar3 = leb__HeapRead((leb_Heap *)leb->buffer,node_00);
      iVar4 = iVar4 + 1;
    } while (1 < uVar3);
  }
  (__return_storage_ptr__->left).id = auVar1._0_4_;
  (__return_storage_ptr__->left).depth = iVar4;
  (__return_storage_ptr__->right).id = auVar1._4_4_;
  (__return_storage_ptr__->right).depth = iVar4;
  (__return_storage_ptr__->edge).id = auVar1._8_4_;
  (__return_storage_ptr__->edge).depth = iVar4;
  (__return_storage_ptr__->node).id = uVar2;
  (__return_storage_ptr__->node).depth = iVar4;
  lVar5 = __return_storage_ptr__->edge;
  node_01.depth = 0;
  node_01.id = leb->maxDepth;
  uVar2 = leb__HeapRead((leb_Heap *)leb->buffer,node_01);
  if (uVar2 != 1) {
    if (lVar5.id != lVar5.depth) {
      lVar5 = (leb_Node)
              (((ulong)lVar5 & 0xffffffff00000000 | (ulong)lVar5 >> 1 & 0x7fffffff) - 0x100000000);
    }
    __return_storage_ptr__->edge = lVar5;
  }
  lVar5 = __return_storage_ptr__->left;
  node_02.depth = 0;
  node_02.id = leb->maxDepth;
  uVar2 = leb__HeapRead((leb_Heap *)leb->buffer,node_02);
  if (uVar2 != 1) {
    if (lVar5.id != lVar5.depth) {
      lVar5 = (leb_Node)
              ((ulong)(lVar5.id * 2) | ((ulong)lVar5 & 0xffffffff00000000) + 0x100000000 | 1);
    }
    __return_storage_ptr__->left = lVar5;
  }
  lVar5 = __return_storage_ptr__->right;
  node_03.depth = 0;
  node_03.id = leb->maxDepth;
  uVar2 = leb__HeapRead((leb_Heap *)leb->buffer,node_03);
  if (uVar2 != 1) {
    if (lVar5.id != lVar5.depth) {
      lVar5 = (leb_Node)((ulong)(lVar5.id * 2) | ((ulong)lVar5 & 0xffffffff00000000) + 0x100000000);
    }
    __return_storage_ptr__->right = lVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

LEBDEF leb_NodeAndNeighbors
leb_DecodeNodeAndNeighbors(const leb_Heap *leb, uint32_t threadID)
{
#define nodeID nodeIDs._reserved
    leb_SameDepthNeighborIDs nodeIDs = {0u, 0u, 0u, 1u};
    int32_t nodeDepth = 0;

    while (leb__HeapRead(leb, {nodeID, nodeDepth}) > 1u) {
        uint32_t cmp = leb__HeapRead(leb, {nodeID << 1u, ++nodeDepth});
        uint32_t b = threadID < cmp ? 0u : 1u;

        nodeIDs = leb__SplitNodeIDs(nodeIDs, b);
        threadID-= cmp * b;
    }

    return leb__NodeAndNeighborsFromSameDepthNeighborIDs(leb, nodeIDs, nodeDepth);
#undef nodeID
}